

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  pthread_mutex_t *bin;
  char cVar3;
  uint32_t uVar4;
  rtree_leaf_elm_t *prVar5;
  arena_t *arena;
  rtree_leaf_elm_t *prVar6;
  uint uVar7;
  int iVar8;
  rtree_leaf_elm_t *prVar9;
  bin_info_t *bin_00;
  mutex_prof_data_t *data;
  ulong uVar10;
  pthread_mutex_t *tsdn_00;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  arena_t *arena_00;
  pthread_mutex_t *__mutex;
  ulong uVar13;
  rtree_ctx_t *ctx;
  bool bVar14;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar9 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar13 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar13);
  prVar5 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar13);
  if (prVar5 == prVar9) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar9) {
    prVar6 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar5;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar9;
    puVar2[1] = (ulong)prVar6;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar11 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar9) {
      uVar10 = 0;
      bVar14 = false;
    }
    else {
      uVar13 = 1;
      prVar12 = prVar11;
      do {
        uVar10 = uVar13;
        bVar14 = 6 < uVar10;
        if (uVar10 == 7) goto LAB_00cff34e;
        prVar11 = prVar12 + 1;
        prVar1 = prVar12 + 1;
        uVar13 = uVar10 + 1;
        prVar12 = prVar11;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar9);
      bVar14 = 6 < uVar10;
    }
    prVar6 = prVar11->leaf;
    prVar11->leafkey = ctx->l2_cache[uVar10].leafkey;
    prVar11->leaf = ctx->l2_cache[uVar10].leaf;
    ctx->l2_cache[uVar10].leafkey = (uintptr_t)prVar5;
    ctx->l2_cache[uVar10].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar9;
    puVar2[1] = (ulong)prVar6;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_00cff34e:
    if (bVar14) {
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,false);
    }
  }
  arena_00 = (arena_t *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  uVar13 = *(ulong *)arena_00->nthreads;
  arena = (arena_t *)duckdb_je_arenas[(uint)uVar13 & 0xfff].repr;
  uVar10 = uVar13 >> 0x14 & 0xff;
  uVar7 = (uint)(uVar13 >> 0x26) & 0x3f;
  uVar13 = (ulong)(uVar7 << 8);
  if ((uint)uVar10 < duckdb_je_bin_info_nbatched_sizes) {
    uVar13 = (ulong)uVar7 * 0x288;
  }
  bin = (pthread_mutex_t *)
        ((long)&arena->nthreads[0].repr + uVar13 + duckdb_je_arena_bin_offsets[uVar10]);
  __mutex = (pthread_mutex_t *)
            ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
            uVar13 + duckdb_je_arena_bin_offsets[uVar10]);
  tsdn_00 = __mutex;
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    tsdn_00 = bin;
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&bin->__data);
    *(undefined1 *)((long)bin + 0x40) = 1;
  }
  *(long *)((long)bin + 0x38) = *(long *)((long)bin + 0x38) + 1;
  if (*(tsdn_t **)((long)bin + 0x30) != tsdn) {
    *(tsdn_t **)((long)bin + 0x30) = tsdn;
    bin[1].__align = bin[1].__align + 1;
  }
  uVar13 = ((long)ptr - *(long *)&arena_00->binshard_next) *
           (ulong)duckdb_je_arena_binind_div_info[uVar10].magic;
  *(ulong *)(arena_00->nthreads + (uVar13 >> 0x26) * 2 + 0x10) =
       *(ulong *)(arena_00->nthreads + (uVar13 >> 0x26) * 2 + 0x10) ^
       1L << ((byte)(uVar13 >> 0x20) & 0x3f);
  uVar13 = *(long *)arena_00->nthreads + 0x10000000;
  *(ulong *)arena_00->nthreads = uVar13;
  uVar7 = (uint)(uVar13 >> 0x1c) & 0x3ff;
  bin_00 = duckdb_je_bin_infos;
  uVar4 = duckdb_je_bin_infos[uVar10].nregs;
  if (uVar7 == uVar4) {
    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
              ((tsdn_t *)&tsdn_00->__data,arena,(edata_t *)arena_00,(bin_t *)&bin->__data);
  }
  else if ((uVar7 == 1) && (*(arena_t **)((long)bin + 0xe0) != arena_00)) {
    arena_bin_slabs_full_remove(arena,(bin_t *)&bin->__data,(edata_t *)arena_00);
    arena_bin_lower_slab((tsdn_t *)arena,arena_00,(edata_t *)&bin->__data,(bin_t *)bin_00);
  }
  bin[3].__align = bin[3].__align + 1;
  *(size_t *)((long)bin + 0x88) = *(size_t *)((long)bin + 0x88) - 1;
  *(undefined1 *)((long)bin + 0x40) = 0;
  pthread_mutex_unlock(__mutex);
  if (uVar7 == uVar4) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,(edata_t *)arena_00);
  }
  if (tsdn != (tsdn_t *)0x0) {
    cVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar8 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar8 + -1;
    if (iVar8 < 1) {
      if (cVar3 < '\x01') {
        uVar13 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar13;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar13 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
      }
      else {
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             0;
      }
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_t *arena = arena_get_from_edata(edata);

	arena_dalloc_bin(tsdn, arena, edata, ptr);
	arena_decay_tick(tsdn, arena);
}